

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsMulti
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *scalingFactorsIndices,int count,double *outSumLogLikelihood)

{
  float fVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int *piVar5;
  float **ppfVar6;
  double *pdVar7;
  uint uVar8;
  float *pfVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  int iVar19;
  float *pfVar20;
  float *pfVar21;
  long lVar22;
  float weight;
  float fVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined8 in_XMM5_Qb;
  vector<float,_std::allocator<float>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_109;
  float *local_108;
  ulong local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  int local_dc;
  ulong local_d8;
  BeagleCPUImpl<float,_1,_0> *local_d0;
  float *local_c8;
  ulong local_c0;
  float *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  float *local_88;
  float *local_80;
  ulong local_78;
  long local_70;
  long local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_b0 = parentBufferIndices;
  local_a8 = childBufferIndices;
  local_a0 = probabilityIndices;
  local_98 = categoryWeightsIndices;
  local_90 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->kPatternCount,(allocator_type *)&local_60);
  std::vector<float,_std::allocator<float>_>::vector(&local_60,(long)this->kPatternCount,&local_109)
  ;
  if (0 < count) {
    local_78 = (ulong)(count - 1);
    uVar18 = (ulong)(uint)count;
    uVar13 = 0;
    local_d8 = uVar18;
    local_d0 = this;
    do {
      local_b8 = this->gPartials[local_b0[uVar13]];
      pfVar17 = this->gTransitionMatrices[local_a0[uVar13]];
      local_c8 = this->gCategoryWeights[local_98[uVar13]];
      local_108 = this->gStateFrequencies[local_90[uVar13]];
      iVar19 = local_a8[uVar13];
      memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
      if ((iVar19 < this->kTipCount) && (piVar5 = this->gTipStates[iVar19], piVar5 != (int *)0x0)) {
        local_f0 = (long)this->kCategoryCount;
        if (0 < local_f0) {
          uVar3 = this->kPatternCount;
          uVar8 = this->kStateCount;
          iVar19 = this->kMatrixSize;
          local_f8 = CONCAT44(local_f8._4_4_,iVar19);
          iVar14 = this->kPartialsPaddedStateCount;
          lVar16 = 0;
          iVar10 = 0;
          lVar12 = 0;
          do {
            if (0 < (int)uVar3) {
              fVar29 = local_c8[lVar16];
              pfVar20 = this->integrationTmp;
              iVar4 = this->kTransPaddedStateCount;
              lVar12 = (long)(int)lVar12;
              pfVar9 = local_b8 + lVar12;
              uVar15 = 0;
              iVar11 = 0;
              do {
                if (0 < (int)uVar8) {
                  pfVar21 = pfVar17 + (long)iVar10 + (long)piVar5[uVar15];
                  uVar18 = 0;
                  do {
                    auVar25 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar21 * pfVar9[uVar18])),
                                              ZEXT416((uint)fVar29),
                                              ZEXT416((uint)pfVar20[(long)iVar11 + uVar18]));
                    pfVar20[(long)iVar11 + uVar18] = auVar25._0_4_;
                    uVar18 = uVar18 + 1;
                    pfVar21 = pfVar21 + iVar4;
                  } while (uVar8 != uVar18);
                  iVar11 = iVar11 + (int)uVar18;
                }
                lVar12 = lVar12 + iVar14;
                uVar15 = uVar15 + 1;
                pfVar9 = pfVar9 + iVar14;
                this = local_d0;
                uVar18 = local_d8;
                local_e8 = lVar16;
              } while (uVar15 != uVar3);
            }
            lVar16 = lVar16 + 1;
            iVar10 = iVar10 + iVar19;
          } while (lVar16 != local_f0);
        }
      }
      else {
        local_70 = (long)this->kCategoryCount;
        if (0 < local_70) {
          local_80 = this->gPartials[iVar19];
          uVar3 = this->kStateCount;
          uVar8 = uVar3 + 3;
          if (-1 < (int)uVar3) {
            uVar8 = uVar3;
          }
          iVar19 = this->kPatternCount;
          local_dc = this->kMatrixSize;
          local_f0 = (long)this->kPartialsPaddedStateCount;
          local_88 = local_80 + 2;
          local_f8 = local_f0 * 4;
          local_100 = 0;
          lVar12 = 0;
          lVar16 = 0;
          do {
            if (0 < iVar19) {
              auVar25._0_8_ = (double)local_c8[lVar12];
              auVar25._8_8_ = in_XMM5_Qb;
              pfVar21 = this->integrationTmp;
              lVar16 = (long)(int)lVar16;
              pfVar9 = local_88 + lVar16;
              pfVar20 = local_80 + lVar16;
              iVar14 = 0;
              lVar22 = 0;
              do {
                if (0 < (int)uVar3) {
                  lVar22 = (long)(int)lVar22;
                  uVar15 = 0;
                  uVar18 = local_100;
                  do {
                    iVar10 = (int)uVar18;
                    if ((int)uVar3 < 4) {
                      uVar18 = 0;
                      auVar26 = ZEXT816(0);
                    }
                    else {
                      auVar26 = ZEXT816(0);
                      uVar18 = 0;
                      do {
                        auVar30._0_4_ =
                             (float)*(undefined8 *)(pfVar17 + (long)iVar10 + uVar18) *
                             (float)*(undefined8 *)(pfVar9 + (uVar18 - 2));
                        auVar30._4_4_ =
                             (float)((ulong)*(undefined8 *)(pfVar17 + (long)iVar10 + uVar18) >> 0x20
                                    ) *
                             (float)((ulong)*(undefined8 *)(pfVar9 + (uVar18 - 2)) >> 0x20);
                        auVar30._8_8_ = 0;
                        auVar33._0_4_ =
                             (float)*(undefined8 *)(pfVar17 + (long)iVar10 + uVar18 + 2) *
                             (float)*(undefined8 *)(pfVar9 + uVar18);
                        auVar33._4_4_ =
                             (float)((ulong)*(undefined8 *)(pfVar17 + (long)iVar10 + uVar18 + 2) >>
                                    0x20) * (float)((ulong)*(undefined8 *)(pfVar9 + uVar18) >> 0x20)
                        ;
                        auVar33._8_8_ = 0;
                        auVar30 = vcvtps2pd_avx(auVar30);
                        dVar24 = auVar26._8_8_;
                        auVar33 = vcvtps2pd_avx(auVar33);
                        auVar26._0_8_ = auVar26._0_8_ + auVar30._0_8_ + auVar33._0_8_;
                        auVar26._8_8_ = dVar24 + auVar30._8_8_ + auVar33._8_8_;
                        uVar18 = uVar18 + 4;
                      } while ((long)uVar18 < (long)(int)(uVar8 & 0xfffffffc));
                    }
                    auVar32 = ZEXT1664(auVar26);
                    dVar24 = auVar26._0_8_;
                    if ((int)uVar18 < (int)uVar3) {
                      uVar18 = uVar18 & 0xffffffff;
                      do {
                        dVar24 = auVar32._0_8_ +
                                 (double)(pfVar17[(long)iVar10 + uVar18] * pfVar20[uVar18]);
                        auVar32 = ZEXT864((ulong)dVar24);
                        uVar18 = uVar18 + 1;
                      } while (uVar3 != uVar18);
                    }
                    auVar26 = vshufpd_avx(auVar26,auVar26,1);
                    auVar31._0_8_ = (double)pfVar21[lVar22];
                    auVar31._8_8_ = in_XMM5_Qb;
                    auVar27._8_8_ = 0;
                    auVar27._0_8_ = (auVar26._0_8_ + dVar24) * (double)local_b8[lVar16 + uVar15];
                    auVar26 = vfmadd231sd_fma(auVar31,auVar25,auVar27);
                    pfVar21[lVar22] = (float)auVar26._0_8_;
                    lVar22 = lVar22 + 1;
                    uVar15 = uVar15 + 1;
                    uVar18 = (ulong)(iVar10 + uVar3 + 1);
                    local_e8 = lVar16;
                  } while (uVar15 != uVar3);
                }
                lVar16 = lVar16 + local_f0;
                iVar14 = iVar14 + 1;
                pfVar9 = pfVar9 + local_f0;
                pfVar20 = pfVar20 + local_f0;
                this = local_d0;
                uVar18 = local_d8;
                local_68 = lVar12;
              } while (iVar14 != iVar19);
            }
            lVar12 = lVar12 + 1;
            local_100 = (ulong)(uint)((int)local_100 + local_dc);
          } while (lVar12 != local_70);
        }
      }
      local_c0 = uVar13;
      if (0 < this->kPatternCount) {
        lVar12 = 0;
        iVar19 = 0;
        pfVar17 = local_108;
        do {
          iVar14 = this->kStateCount;
          if ((long)iVar14 < 1) {
            auVar32 = ZEXT864(0);
          }
          else {
            auVar32 = ZEXT864(0);
            lVar16 = 0;
            do {
              auVar25 = vfmadd231ss_fma(auVar32._0_16_,ZEXT416((uint)pfVar17[lVar16]),
                                        ZEXT416((uint)this->integrationTmp[iVar19 + lVar16]));
              auVar32 = ZEXT1664(auVar25);
              lVar16 = lVar16 + 1;
            } while (iVar14 != lVar16);
            iVar19 = iVar19 + iVar14;
          }
          fVar29 = auVar32._0_4_;
          if (*scalingFactorsIndices != -1) {
            ppfVar6 = this->gScaleBuffers;
            pfVar9 = ppfVar6[scalingFactorsIndices[uVar13]];
            if (uVar13 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar12] = 0;
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12] = pfVar9[lVar12];
              if (count != 1) {
                fVar23 = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar12];
                uVar15 = 1;
                do {
                  fVar1 = ppfVar6[scalingFactorsIndices[uVar15]][lVar12];
                  if (fVar23 < fVar1) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12] = (int)uVar15;
                    local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12] = fVar1;
                    fVar23 = fVar1;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar18 != uVar15);
              }
            }
            if (uVar13 != (uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar12]) {
              dVar24 = exp((double)(pfVar9[lVar12] -
                                   local_60.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar12]));
              fVar29 = (float)(dVar24 * (double)fVar29);
              pfVar17 = local_108;
            }
          }
          if (uVar13 == 0) {
            this->outLogLikelihoodsTmp[lVar12] = fVar29;
          }
          else {
            if (uVar13 == local_78) {
              dVar24 = log((double)(fVar29 + this->outLogLikelihoodsTmp[lVar12]));
              fVar29 = (float)dVar24;
              pfVar9 = this->outLogLikelihoodsTmp;
              pfVar17 = local_108;
            }
            else {
              pfVar9 = this->outLogLikelihoodsTmp;
              fVar29 = fVar29 + pfVar9[lVar12];
            }
            pfVar9[lVar12] = fVar29;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < this->kPatternCount);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar18);
  }
  if ((*scalingFactorsIndices != -1) && (iVar19 = this->kPatternCount, 0 < (long)iVar19)) {
    pfVar17 = this->outLogLikelihoodsTmp;
    lVar12 = 0;
    do {
      pfVar17[lVar12] =
           local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[lVar12] + pfVar17[lVar12];
      lVar12 = lVar12 + 1;
    } while (iVar19 != lVar12);
  }
  *outSumLogLikelihood = 0.0;
  iVar19 = this->kPatternCount;
  if (0 < (long)iVar19) {
    pdVar7 = this->gPatternWeights;
    pfVar17 = this->outLogLikelihoodsTmp;
    auVar32 = ZEXT864((ulong)*outSumLogLikelihood);
    lVar12 = 0;
    do {
      auVar28._0_8_ = (double)pfVar17[lVar12];
      auVar28._8_8_ = in_XMM5_Qb;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pdVar7[lVar12];
      auVar25 = vfmadd231sd_fma(auVar32._0_16_,auVar28,auVar2);
      auVar32 = ZEXT1664(auVar25);
      *outSumLogLikelihood = auVar25._0_8_;
      lVar12 = lVar12 + 1;
    } while (iVar19 != lVar12);
  }
  dVar24 = *outSumLogLikelihood;
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (uint)(!NAN(dVar24) && !NAN(dVar24)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsMulti(const int* parentBufferIndices,
                                                                   const int* childBufferIndices,
                                                                   const int* probabilityIndices,
                                                                   const int* categoryWeightsIndices,
                                                                   const int* stateFrequenciesIndices,
                                                                   const int* scalingFactorsIndices,
                                                                   int count,
                                                                   double* outSumLogLikelihood) {

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const REALTYPE* partialsParent = gPartials[parentBufferIndices[subsetIndex]];
        const REALTYPE* transMatrix = gTransitionMatrices[probabilityIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        int childIndex = childBufferIndices[subsetIndex];

        memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = 0; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }
        } else {
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = 0;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0;
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
//                        for(int j = 0; j < kStateCount; j++) {
//                            sumOverJ += transMatrix[w] * partialsChild[v + j];
//                            w++;
//                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }

        }
        int u = 0;
        for(int k = 0; k < kPatternCount; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
                int cumulativeScalingFactorIndex;
                cumulativeScalingFactorIndex = scalingFactorsIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        tmpScaleFactor = gScaleBuffers[scalingFactorsIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sumOverI *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }



            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sumOverI;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sumOverI;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sumOverI;
            }

        }

    }

    if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }


    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}